

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

void FAudio_INTERNAL_DecodePCM32
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  int in_ECX;
  float *in_RDX;
  long in_RSI;
  long in_RDI;
  
  (*FAudio_INTERNAL_Convert_S32_To_F32)
            ((int32_t *)
             (*(long *)(in_RSI + 8) +
             (ulong)(*(int *)(in_RDI + 0xf0) * (uint)*(ushort *)(*(long *)(in_RDI + 0xf8) + 2)) * 4)
             ,in_RDX,in_ECX * (uint)*(ushort *)(*(long *)(in_RDI + 0xf8) + 2));
  return;
}

Assistant:

void FAudio_INTERNAL_DecodePCM32(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	LOG_FUNC_ENTER(voice->audio)
	FAudio_INTERNAL_Convert_S32_To_F32(
		((int32_t*) buffer->pAudioData) + (
			voice->src.curBufferOffset * voice->src.format->nChannels
		),
		decodeCache,
		samples * voice->src.format->nChannels
	);
	LOG_FUNC_EXIT(voice->audio)
}